

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo
          (RpcConnectionState *this,Reader *disembargo)

{
  PromiseArenaMember *pPVar1;
  HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this_00;
  ushort uVar2;
  short sVar3;
  unsigned_short uVar4;
  uint uVar5;
  int *piVar6;
  Embargo *pEVar7;
  Disposer *pDVar8;
  undefined8 *puVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  SegmentBuilder *node;
  PointerType PVar12;
  ulong uVar13;
  long lVar14;
  _func_int *p_Var15;
  Entry *pEVar16;
  PromiseFulfiller<void> *pPVar17;
  SegmentReader *pSVar18;
  int iVar19;
  _func_int **pp_Var20;
  Disposer *disposerCopy;
  bool bVar21;
  ArrayPtr<const_unsigned_char> value;
  Own<capnp::ClientHook,_std::nullptr_t> target;
  void *continuationTracePtr;
  Fault f;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> nextMsg;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:4183:19),_void>
  promise;
  undefined1 local_148 [16];
  WirePointer *local_138;
  anon_union_16_1_a8a2e026_for_OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>_2
  local_130;
  undefined1 local_118 [48];
  anon_union_16_1_a8a2e026_for_OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>_2
  local_e8;
  undefined8 local_d8;
  uint uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined2 local_c4;
  undefined4 local_c0;
  undefined8 local_b8 [2];
  undefined1 local_a8 [32];
  StructBuilder local_88;
  StructBuilder local_58;
  
  pSVar18 = (disembargo->_reader).segment;
  local_118._8_8_ = (disembargo->_reader).capTable;
  piVar6 = (int *)(disembargo->_reader).data;
  local_118._16_8_ = (disembargo->_reader).pointers;
  uVar5 = (disembargo->_reader).dataSize;
  uVar2 = (disembargo->_reader).pointerCount;
  local_118._24_4_ = (disembargo->_reader).nestingLimit;
  if (0x2f < uVar5) {
    sVar3 = (short)piVar6[1];
    if (sVar3 == 2) {
      if (uVar2 < 2) {
        local_118._8_8_ = (CapTableReader *)0x0;
        local_d8 = (WirePointer *)0x0;
        pSVar18 = (SegmentReader *)0x0;
        local_118._24_4_ = 0x7fffffff;
      }
      else {
        local_d8 = local_118._16_8_ + 8;
      }
      uStack_d0 = local_118._24_4_;
      local_e8._0_8_ = pSVar18;
      local_e8._8_8_ = local_118._8_8_;
      value = (ArrayPtr<const_unsigned_char>)
              PointerReader::getBlob<capnp::Data>((PointerReader *)&local_e8,(void *)0x0,0);
      bVar21 = (disembargo->_reader).pointerCount == 0;
      local_118._16_8_ = (disembargo->_reader).pointers;
      if (bVar21) {
        local_118._16_8_ = (WirePointer *)0x0;
      }
      local_118._24_4_ = 0x7fffffff;
      if (!bVar21) {
        local_118._24_4_ = (disembargo->_reader).nestingLimit;
      }
      local_118._0_4_ = 0;
      local_118._4_4_ = 0;
      local_118._8_4_ = 0;
      local_118._12_4_ = 0;
      if (!bVar21) {
        local_118._0_4_ = *(undefined4 *)&(disembargo->_reader).segment;
        local_118._4_4_ = *(undefined4 *)((long)&(disembargo->_reader).segment + 4);
        local_118._8_4_ = *(undefined4 *)&(disembargo->_reader).capTable;
        local_118._12_4_ = *(undefined4 *)((long)&(disembargo->_reader).capTable + 4);
      }
      PointerReader::getStruct((StructReader *)&local_e8,(PointerReader *)local_118,(word *)0x0);
      if (0x2f < (uint)local_c8) {
        uVar4 = (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_d8 + 4))->structRef).dataSize.
                value;
        if (uVar4 == 1) {
          bVar21 = local_c4 == 0;
          local_138 = (WirePointer *)_uStack_d0;
          if (bVar21) {
            local_138 = (WirePointer *)0x0;
          }
          local_130._0_4_ = 0x7fffffff;
          if (!bVar21) {
            local_130._0_4_ = local_c0;
          }
          local_148._0_4_ = 0;
          local_148._4_4_ = 0;
          local_148._8_4_ = 0;
          local_148._12_4_ = 0;
          if (!bVar21) {
            local_148._0_4_ = local_e8._0_4_;
            local_148._4_4_ = local_e8._4_4_;
            local_148._8_4_ = local_e8._8_4_;
            local_148._12_4_ = local_e8._12_4_;
          }
          PointerReader::getStruct((StructReader *)local_118,(PointerReader *)local_148,(word *)0x0)
          ;
          if (local_118._36_2_ == 0) {
            local_148._0_8_ = (SegmentReader *)0x0;
            local_148._8_8_ = (CapTableReader *)0x0;
            local_138 = (WirePointer *)0x0;
            local_118._40_4_ = 0x7fffffff;
          }
          else {
            local_148._0_8_ = local_118._0_8_;
            local_148._8_8_ = local_118._8_8_;
            local_138 = (WirePointer *)local_118._24_8_;
          }
          local_130._0_4_ = local_118._40_4_;
          PVar12 = PointerReader::getPointerType((PointerReader *)local_148);
          local_88.segment = (SegmentBuilder *)CONCAT71(local_88.segment._1_7_,PVar12 == NULL_);
          if (PVar12 != NULL_) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[70]>
                      ((Fault *)local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x10d0,FAILED,"!promisedAnswer.hasTransform()",
                       "_kjCondition,\"Disembargo sent to Provide operation cannot include a transformation.\""
                       ,(DebugExpression<bool> *)&local_88,
                       (char (*) [70])
                       "Disembargo sent to Provide operation cannot include a transformation.");
            kj::_::Debug::Fault::fatal((Fault *)local_148);
          }
          anon_unknown_18::
          ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::find
                    ((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
                      *)local_148,(int)this + 0x2d8);
          if ((SegmentReader *)local_148._0_8_ == (SegmentReader *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                      ((Fault *)local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x10d3,FAILED,"answers.find(promisedAnswer.getQuestionId()) != nullptr",
                       "\"Disembargo specified a provision ID (question ID) that doesn\'t exist.\"",
                       (char (*) [70])
                       "Disembargo specified a provision ID (question ID) that doesn\'t exist.");
            kj::_::Debug::Fault::fatal((Fault *)local_148);
          }
          if (*(int *)&((PromiseArenaMember *)(local_148._0_8_ + 0x10))->_vptr_PromiseArenaMember ==
              4) {
            pPVar1 = (PromiseArenaMember *)(local_148._0_8_ + 0x20);
            if (*(int *)(pPVar1->_vptr_PromiseArenaMember + 2) == 1) {
              local_148 = (undefined1  [16])value;
              local_88.segment = (SegmentBuilder *)local_148;
              pEVar16 = kj::
                        Table<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>>
                        ::
                        FindOrCreateImpl<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide::findOrCreateThirdPartyEmbargo(kj::ArrayPtr<unsigned_char_const>)::{lambda()#1},kj::ArrayPtr<unsigned_char_const>&>
                        ::apply<0ul>((Table<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Callbacks>_>
                                      *)(pPVar1->_vptr_PromiseArenaMember + 5),
                                     (StringPtr *)local_148,
                                     (anon_class_8_1_3fcf65d9_conflict *)&local_88);
              pDVar8 = pEVar16[1].value.disposer;
              (*pDVar8->_vptr_Disposer[2])(pDVar8,local_148);
              return;
            }
            local_88.segment = (SegmentBuilder *)0x0;
            local_148 = ZEXT816(0);
            kj::_::Debug::Fault::init
                      ((Fault *)&local_88,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                      );
            kj::_::Debug::Fault::fatal((Fault *)&local_88);
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
                    ((Fault *)local_148,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d6,FAILED,"answer.task.tryGet<Answer::Provide>() != nullptr",
                     "\"Disembargo specified a question ID that didn\'t belong to a Provide operation.\""
                     ,(char (*) [78])
                      "Disembargo specified a question ID that didn\'t belong to a Provide operation."
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_148);
        }
        if (uVar4 != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader&>
                    ((Fault *)local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10e2,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
                     (char (*) [29])"Unknown message target type.",(Reader *)&local_e8);
          kj::_::Debug::Fault::fatal((Fault *)local_118);
        }
      }
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::find
                ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
                 local_118,(int)this + 0x1b8);
      if ((SegmentReader *)local_118._0_8_ == (SegmentReader *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x109f,FAILED,"exports.find(target.getImportedCap()) != nullptr",
                   "\"Message target is not a current export ID.\"",
                   (char (*) [43])"Message target is not a current export ID.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      pp_Var20 = ((PromiseArenaMember *)(local_118._0_8_ + 0x30))->_vptr_PromiseArenaMember;
      if (pp_Var20 == (_func_int **)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10a1,FAILED,"exp.vineInfo != nullptr","\"Disembargo target is not a vine.\"",
                   (char (*) [33])"Disembargo target is not a vine.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      iVar19 = *(int *)pp_Var20;
      if (iVar19 == 2) {
        pp_Var20 = ((PromiseArenaMember *)(local_118._0_8_ + 0x10))->_vptr_PromiseArenaMember;
        if ((pp_Var20 == (_func_int **)0x0) || ((RpcSystemBrand *)pp_Var20[1] != (this->brand).ptr))
        {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_148._8_8_;
          local_148 = auVar10 << 0x40;
          local_118._0_8_ = (SegmentReader *)0x0;
          local_118._8_8_ = (CapTableReader *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_148,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_148);
        }
        p_Var15 = pp_Var20[5];
      }
      else {
        if (iVar19 != 1) {
          return;
        }
        pp_Var20 = (_func_int **)pp_Var20[2];
        p_Var15 = pp_Var20[3];
        if (p_Var15 == (_func_int *)0x0) {
          return;
        }
      }
      if (*(int *)(p_Var15 + 0x20) != 1) {
        return;
      }
      puVar9 = *(undefined8 **)(p_Var15 + 0x38);
      if (puVar9 == (undefined8 *)0x0) {
        return;
      }
      (**(code **)*puVar9)(local_b8,puVar9,(int)(value.size_ >> 3) + 0x1b);
      (*(code *)**(undefined8 **)local_b8[1])(local_a8);
      local_88.data = (void *)local_a8._16_8_;
      local_88.segment = (SegmentBuilder *)local_a8._0_8_;
      local_88.capTable = (CapTableBuilder *)local_a8._8_8_;
      PointerBuilder::initStruct
                ((StructBuilder *)local_118,(PointerBuilder *)&local_88,(StructSize)0x10001);
      *(undefined2 *)local_118._16_8_ = 0xd;
      local_88.segment = (SegmentBuilder *)local_118._0_8_;
      local_88.capTable = (CapTableBuilder *)local_118._8_8_;
      local_88.data = (void *)local_118._24_8_;
      PointerBuilder::initStruct
                ((StructBuilder *)local_148,(PointerBuilder *)&local_88,(StructSize)0x20001);
      local_118._16_8_ = CONCAT44(local_130._4_4_,local_130._0_4_) + 8;
      (local_138->field_1).structRef.dataSize.value = 2;
      local_118._0_8_ = local_148._0_8_;
      local_118._8_8_ = local_148._8_8_;
      PointerBuilder::setBlob<capnp::Data>((PointerBuilder *)local_118,(Reader)value);
      if (iVar19 == 1) {
        local_a8._0_8_ = local_148._0_8_;
        local_a8._8_8_ = local_148._8_8_;
        PointerBuilder::initStruct(&local_88,(PointerBuilder *)local_a8,(StructSize)0x10001);
        ((char *)((long)local_88.data + 4))[0] = '\x01';
        ((char *)((long)local_88.data + 4))[1] = '\0';
        local_a8._0_8_ = local_88.segment;
        local_a8._8_8_ = local_88.capTable;
        local_a8._16_8_ = local_88.pointers;
        PointerBuilder::initStruct
                  ((StructBuilder *)local_118,(PointerBuilder *)local_a8,(StructSize)0x10001);
        *(undefined4 *)local_118._16_8_ = *(undefined4 *)(pp_Var20 + 4);
      }
      else {
        local_88.data = (void *)CONCAT44(local_130._4_4_,local_130._0_4_);
        local_88.segment = (SegmentBuilder *)local_148._0_8_;
        local_88.capTable = (CapTableBuilder *)local_148._8_8_;
        PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_88,(StructSize)0x10001);
        (**(code **)(*pp_Var20 + 0x50))(local_a8,pp_Var20);
        local_118._0_8_ = local_a8._0_8_;
        local_118._8_8_ = local_a8._8_8_;
        local_118._16_8_ = &kj::none;
        local_118._24_8_ = " == ";
        local_118._32_8_ = 5;
        local_118[0x28] = (CapTableReader *)local_a8._8_8_ == (CapTableReader *)0x0;
        if ((CapTableReader *)local_a8._8_8_ != (CapTableReader *)0x0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::None_const&>&>
                    ((Fault *)&local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10c0,FAILED,"import->writeTarget(nextDisembargo.initTarget()) == kj::none",
                     "_kjCondition,",
                     (DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
                      *)local_118);
          kj::_::Debug::Fault::fatal((Fault *)&local_88);
        }
      }
      (**(code **)(*(long *)local_b8[1] + 0x10))();
      uVar11 = local_b8[1];
      if ((long *)local_b8[1] == (long *)0x0) {
        return;
      }
      local_b8[1] = 0;
      (*(code *)**(undefined8 **)local_b8[0])
                (local_b8[0],uVar11 + *(long *)(*(long *)uVar11 + -0x10));
      return;
    }
    if (sVar3 == 1) {
      uVar13 = (ulong)*piVar6;
      local_118._0_4_ = *piVar6;
      if ((long)uVar13 < 0) {
        kj::
        Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
        ::find<0ul,unsigned_int&>
                  ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
                    *)local_e8.space,(uint *)&(this->embargoes).highSlots);
        if ((Entry *)local_e8._0_8_ == (Entry *)0x0) goto LAB_00336ba6;
        pPVar17 = (PromiseFulfiller<void> *)
                  ((PromiseArenaMember *)(local_e8._0_8_ + 0x10))->_vptr_PromiseArenaMember;
        if (pPVar17 == (PromiseFulfiller<void> *)0x0) {
          local_118._0_8_ = (SegmentReader *)0x0;
          local_e8._0_8_ = 0;
          local_e8._8_8_ = 0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_118,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_118);
        }
      }
      else {
        pEVar7 = (this->embargoes).slots.builder.ptr;
        if (((ulong)((long)(this->embargoes).slots.builder.pos - (long)pEVar7 >> 4) <= uVar13) ||
           (pPVar17 = pEVar7[uVar13].fulfiller.ptr.ptr, pPVar17 == (PromiseFulfiller<void> *)0x0)) {
LAB_00336ba6:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                    ((Fault *)&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x1093,FAILED,(char *)0x0,
                     "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                     (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'."
                    );
          kj::_::Debug::Fault::fatal((Fault *)&local_e8);
        }
      }
      (*(pPVar17->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar17,&local_e8);
      lVar14 = (long)*piVar6;
      local_148._0_4_ = *piVar6;
      if (lVar14 < 0) {
        this_00 = &(this->embargoes).highSlots;
        kj::
        Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
        ::find<0ul,unsigned_int&>
                  ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>>
                    *)local_e8.space,(uint *)this_00);
        if ((Entry *)local_e8._0_8_ == (Entry *)0x0) {
          local_118._0_8_ = (SegmentReader *)0x0;
          local_e8._0_8_ = 0;
          local_e8._8_8_ = 0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_118,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_118);
        }
        kj::
        Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Callbacks>_>
        ::release((Entry *)&local_e8,&this_00->table,(Entry *)local_e8._0_8_);
      }
      else {
        pEVar7 = (this->embargoes).slots.builder.ptr;
        pDVar8 = pEVar7[lVar14].fulfiller.ptr.disposer;
        pPVar17 = pEVar7[lVar14].fulfiller.ptr.ptr;
        pEVar7[lVar14].fulfiller.ptr.disposer = (Disposer *)0x0;
        pEVar7[lVar14].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
        std::
        priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
        ::push(&(this->embargoes).freeIds,(value_type *)local_148);
        local_e8._8_8_ = pDVar8;
        local_d8 = pPVar17;
      }
      if ((PromiseFulfiller<void> *)local_d8 != (PromiseFulfiller<void> *)0x0) {
        (**((Disposer *)local_e8._8_8_)->_vptr_Disposer)
                  (local_e8._8_8_,
                   (_func_int *)
                   ((long)&(((PromiseFulfiller<void> *)local_d8)->super_PromiseRejector).
                           _vptr_PromiseRejector +
                   (long)(((PromiseFulfiller<void> *)local_d8)->super_PromiseRejector).
                         _vptr_PromiseRejector[-2]));
      }
      checkIfBecameIdle(this);
      return;
    }
    if (sVar3 != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                ((Fault *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x10e9,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                 (char (*) [31])"Unimplemented Disembargo type.",disembargo);
      kj::_::Debug::Fault::fatal((Fault *)&local_e8);
    }
  }
  iVar19 = 0;
  if (uVar2 == 0) {
    local_118._24_4_ = 0x7fffffff;
    local_118._8_8_ = (CapTableReader *)0x0;
    local_118._16_8_ = (WirePointer *)0x0;
    pSVar18 = (SegmentReader *)0x0;
  }
  local_118._0_8_ = pSVar18;
  PointerReader::getStruct((StructReader *)&local_e8,(PointerReader *)local_118,(word *)0x0);
  getMessageTarget((RpcConnectionState *)local_148,(Reader *)this);
  if (0x1f < uVar5) {
    iVar19 = *piVar6;
  }
  ClientHook::whenResolved((ClientHook *)&local_e8);
  kj::Promise<void>::
  then<capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_1_>
            ((Promise<void> *)&local_88,(anon_class_1_0_00000001_for_func *)local_e8.space);
  uVar11 = local_e8._0_8_;
  if ((Entry *)local_e8._0_8_ != (Entry *)0x0) {
    local_e8._0_8_ = 0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar11);
  }
  local_e8._8_4_ = iVar19;
  local_d8 = local_148._0_8_;
  _uStack_d0 = local_148._8_8_;
  local_148._8_8_ = 0;
  local_118._0_8_ =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:4189:32)>
       ::anon_class_32_3_62e1cf96_for_func::operator();
  local_e8._0_8_ = this;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_2_>,kj::_::PromiseDisposer,capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_2_,void*&>
            ((PromiseDisposer *)local_a8,(OwnPromiseNode *)&local_88,
             (anon_class_32_3_62e1cf96_for_func *)&local_e8,(void **)local_118);
  kj::TaskSet::add(&this->tasks,(Promise<void> *)local_a8);
  uVar11 = local_a8._0_8_;
  if ((SegmentReader *)local_a8._0_8_ != (SegmentReader *)0x0) {
    local_a8._0_8_ = (SegmentReader *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar11);
  }
  uVar11 = _uStack_d0;
  if ((_func_int **)_uStack_d0 != (_func_int **)0x0) {
    _uStack_d0 = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_d8)(local_d8,uVar11 + *(long *)(*(_func_int **)uVar11 + -0x10))
    ;
  }
  node = local_88.segment;
  if (local_88.segment != (SegmentBuilder *)0x0) {
    local_88.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  uVar11 = local_148._8_8_;
  if ((_func_int **)local_148._8_8_ != (_func_int **)0x0) {
    local_148._8_8_ = 0;
    (**(code **)*(_func_int **)local_148._0_8_)
              (local_148._0_8_,uVar11 + *(long *)(*(_func_int **)uVar11 + -0x10));
  }
  return;
}

Assistant:

void handleDisembargo(const rpc::Disembargo::Reader& disembargo) {
    auto context = disembargo.getContext();
    switch (context.which()) {
      case rpc::Disembargo::Context::SENDER_LOOPBACK: {
        kj::Own<ClientHook> target = getMessageTarget(disembargo.getTarget());

        EmbargoId embargoId = context.getSenderLoopback();

        // It's possible that `target` is a promise capability that hasn't resolved yet, in which
        // case we must wait for the resolution. In particular this can happen in the case where
        // we have Alice -> Bob -> Carol, Alice makes a call that proxies from Bob to Carol, and
        // Carol returns a capability from this call that points all the way back though Bob to
        // Alice. When this return capability passes through Bob, Bob will resolve the previous
        // promise-pipeline capability to it. However, Bob has to send a Disembargo to Carol before
        // completing this resolution. In the meantime, though, Bob returns the final response to
        // Alice. Alice then *also* sends a Disembargo to Bob. The Alice -> Bob Disembargo might
        // arrive at Bob before the Bob -> Carol Disembargo has resolved, in which case the
        // Disembargo is delivered to a promise capability.
        auto promise = target->whenResolved()
            .then([]() {
          // We also need to insert yieldUntilQueueEmpty() here to make sure that any pending calls
          // towards this cap have had time to find their way through the event loop.
          return kj::yieldUntilQueueEmpty();
        });

        tasks.add(promise.then([this, embargoId, target = kj::mv(target)]() mutable {
          for (;;) {
            KJ_IF_SOME(r, target->getResolved()) {
              target = r.addRef();
            } else {
              break;
            }
          }

          KJ_REQUIRE(unwrapIfSameConnection(*target) != kj::none,
                    "'Disembargo' of type 'senderLoopback' sent to an object that does not point "
                    "back to the sender.") {
            return;
          }

          if (!connection.is<Connected>()) {
            return;
          }

          RpcClient& downcasted = kj::downcast<RpcClient>(*target);

          auto message = connection.get<Connected>().connection->newOutgoingMessage(
              messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);
          auto builder = message->getBody().initAs<rpc::Message>().initDisembargo();

          {
            auto redirect = downcasted.writeTarget(builder.initTarget());

            // Disembargoes should only be sent to capabilities that were previously the subject of
            // a `Resolve` message.  But `writeTarget` only ever returns non-null when called on
            // a PromiseClient.  The code which sends `Resolve` and `Return` should have replaced
            // any promise with a direct node in order to solve the Tribble 4-way race condition.
            // See the documentation of Disembargo in rpc.capnp for more.
            KJ_REQUIRE(redirect == kj::none,
                      "'Disembargo' of type 'senderLoopback' sent to an object that does not "
                      "appear to have been the subject of a previous 'Resolve' message.") {
              return;
            }
          }

          builder.getContext().setReceiverLoopback(embargoId);

          message->send();
        }));

        break;
      }

      case rpc::Disembargo::Context::RECEIVER_LOOPBACK: {
        KJ_IF_SOME(embargo, embargoes.find(context.getReceiverLoopback())) {
          KJ_ASSERT_NONNULL(embargo.fulfiller)->fulfill();
          embargoes.erase(context.getReceiverLoopback(), embargo);
          checkIfBecameIdle();
        } else {
          KJ_FAIL_REQUIRE("Invalid embargo ID in 'Disembargo.context.receiverLoopback'.");
        }
        break;
      }